

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

_HashNode * __thiscall SQTable::GetNodeFromTypeHint(SQTable *this,uint64_t hint,SQObjectPtr *key)

{
  _HashNode *p_Var1;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)hint & 0x1f);
  if (uVar2 <= this->_numofnodes_minus_one) {
    if ((this->_nodes[uVar2].key.super_SQObject._type == OT_STRING) &&
       (p_Var1 = this->_nodes + uVar2,
       (p_Var1->key).super_SQObject._unVal.pTable == (key->super_SQObject)._unVal.pTable)) {
      return p_Var1;
    }
  }
  return (_HashNode *)0x0;
}

Assistant:

inline _HashNode *GetNodeFromTypeHint(uint64_t hint, const SQObjectPtr &key) const {
        size_t nodeIdx = size_t(hint & TBL_CLASS_TYPE_MEMBER_MASK);
        if (nodeIdx > _numofnodes_minus_one)
            assert(!"Node index is out of range");
        else if (!sq_isstring(_nodes[nodeIdx].key))
            assert(!"Node key is not a string");
        else if (_string(_nodes[nodeIdx].key) != _string(key))
            assert(!"Literal key mismatch");
        else
            return _nodes + nodeIdx;
        return nullptr;
    }